

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.h
# Opt level: O0

void __thiscall slang::parsing::NumberParser::checkIntOverflow(NumberParser *this,Token token)

{
  bool bVar1;
  SVInt *in_RDI;
  NumberParser *unaff_retaddr;
  Token in_stack_00000008;
  int in_stack_ffffffffffffff8c;
  uint uVar2;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar3;
  SVInt *in_stack_ffffffffffffffa0;
  
  uVar3 = (int)(in_RDI->super_SVIntStorage).bitWidth < 1;
  Token::intValue((Token *)CONCAT17(uVar3,in_stack_ffffffffffffff98));
  SVInt::SVInt<int>(in_RDI,in_stack_ffffffffffffff8c);
  SVInt::operator>((SVInt *)CONCAT17(uVar3,in_stack_ffffffffffffff98),in_RDI);
  bVar1 = operator&&(false,(logic_t)0x0);
  uVar2 = (uint)bVar1 << 0x10;
  SVInt::~SVInt(in_stack_ffffffffffffffa0);
  SVInt::~SVInt(in_stack_ffffffffffffffa0);
  if ((uVar2 & 0x10000) != 0) {
    reportIntOverflow(unaff_retaddr,in_stack_00000008);
  }
  return;
}

Assistant:

void checkIntOverflow(Token token) {
        if (languageVersion < LanguageVersion::v1800_2023 && token.intValue() > INT32_MAX)
            reportIntOverflow(token);
    }